

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slots.cpp
# Opt level: O0

void __thiscall MainWindow::openFile(MainWindow *this,QString *path)

{
  uint uVar1;
  QString local_f0;
  QString local_d8;
  QString local_c0;
  QString local_a8;
  QString local_90;
  FormatError local_74;
  undefined1 local_70 [4];
  FormatError error;
  QMessageBox local_58 [8];
  QMessageBox msgbox;
  bool opened;
  QCursor local_20 [8];
  QString *local_18;
  QString *path_local;
  MainWindow *this_local;
  
  local_18 = path;
  path_local = (QString *)this;
  Renderer::forceStop(this->mRenderer);
  QCursor::QCursor(local_20,WaitCursor);
  QGuiApplication::setOverrideCursor(local_20);
  QCursor::~QCursor(local_20);
  uVar1 = ModuleFile::open(&this->mModuleFile,(char *)local_18,(int)this->mModule);
  QGuiApplication::restoreOverrideCursor();
  if ((uVar1 & 1) == 0) {
    QMessageBox::QMessageBox(local_58,(QWidget *)0x0);
    QMessageBox::setIcon((Icon)local_58);
    tr((QString *)local_70,"Could not open module",(char *)0x0,-1);
    QMessageBox::setText((QString *)local_58);
    QString::~QString((QString *)local_70);
    local_74 = ModuleFile::lastError(&this->mModuleFile);
    if (local_74 - invalidSignature < 5 || local_74 == unknownChannel) {
      switch((long)&switchD_001932d0::switchdataD_0025b050 +
             (long)(int)(&switchD_001932d0::switchdataD_0025b050)[local_74 - invalidSignature]) {
      case 0x1932fd:
        tr(&local_90,"The file is not a trackerboy module",(char *)0x0,-1);
        QMessageBox::setInformativeText((QString *)local_58);
        QString::~QString(&local_90);
        break;
      case 0x19335b:
        tr(&local_a8,"The module is from a newer version of Trackerboy",(char *)0x0,-1);
        QMessageBox::setInformativeText((QString *)local_58);
        QString::~QString(&local_a8);
        break;
      case 0x1933b9:
        tr(&local_c0,"Failed to upgrade the module",(char *)0x0,-1);
        QMessageBox::setInformativeText((QString *)local_58);
        QString::~QString(&local_c0);
        break;
      default:
        tr(&local_d8,"The module is corrupted",(char *)0x0,-1);
        QMessageBox::setInformativeText((QString *)local_58);
        QString::~QString(&local_d8);
      }
    }
    else {
      tr(&local_f0,"The file could not be read",(char *)0x0,-1);
      QMessageBox::setInformativeText((QString *)local_58);
      QString::~QString(&local_f0);
    }
    QDialog::exec();
    ModuleFile::setName(&this->mModuleFile,&this->mUntitledString);
    QMessageBox::~QMessageBox(local_58);
  }
  else {
    pushRecentFile(this,local_18);
  }
  updateWindowTitle(this);
  return;
}

Assistant:

void MainWindow::openFile(QString const& path) {
    mRenderer->forceStop();

    QApplication::setOverrideCursor(Qt::WaitCursor);
    bool opened = mModuleFile.open(path, *mModule);
    QApplication::restoreOverrideCursor();

    if (opened) {
        pushRecentFile(path);
    } else {
        QMessageBox msgbox;
        msgbox.setIcon(QMessageBox::Critical);
        msgbox.setText(tr("Could not open module"));

        auto error = mModuleFile.lastError();
        switch (error) {
            case trackerboy::FormatError::invalidSignature:
                msgbox.setInformativeText(tr("The file is not a trackerboy module"));
                break;
            case trackerboy::FormatError::invalidRevision:
                msgbox.setInformativeText(tr("The module is from a newer version of Trackerboy"));
                break;
            case trackerboy::FormatError::cannotUpgrade:
                msgbox.setInformativeText(tr("Failed to upgrade the module"));
                break;
            case trackerboy::FormatError::duplicateId:
            case trackerboy::FormatError::invalid:
            case trackerboy::FormatError::unknownChannel:
                msgbox.setInformativeText(tr("The module is corrupted"));
                break;
            default:
                msgbox.setInformativeText(tr("The file could not be read"));
                break;
        }


        msgbox.exec();
        mModuleFile.setName(mUntitledString);

    }

    // update window title with document name
    updateWindowTitle();
}